

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O2

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  Lexer *this_00;
  FileReader *pFVar1;
  BindingEnv *parent;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  BindingEnv *this_01;
  __node_base *p_Var6;
  string *psVar7;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  EvalString let_value;
  string dir_err;
  string rel_path;
  string key;
  string prev_cwd;
  EvalString eval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string parent_path;
  string path;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar3 = Lexer::ReadPath(this_00,&eval,err);
  if (bVar3) {
    EvalString::Evaluate_abi_cxx11_(&path,&eval,(Env *)this->env_);
    bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    if (bVar3) {
      std::__cxx11::string::string
                ((string *)&parent_path,(string *)&(this->env_->super_RelPathEnv).abs_path_);
      dir_err._M_dataplus._M_p = (pointer)&dir_err.field_2;
      dir_err._M_string_length = 0;
      prev_cwd._M_dataplus._M_p = (pointer)&prev_cwd.field_2;
      prev_cwd._M_string_length = 0;
      bVar2 = false;
      dir_err.field_2._M_local_buf[0] = '\0';
      prev_cwd.field_2._M_local_buf[0] = '\0';
      rel_path._M_dataplus._M_p = (pointer)&rel_path.field_2;
      rel_path._M_string_length = 0;
      rel_path.field_2._M_local_buf[0] = '\0';
      while (bVar3 = Lexer::PeekToken(this_00,INDENT), bVar3) {
        key._M_dataplus._M_p = (pointer)&key.field_2;
        key._M_string_length = 0;
        key.field_2._M_allocated_capacity = key.field_2._M_allocated_capacity & 0xffffffffffffff00;
        let_value.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        let_value.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        let_value.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = ParseLet(this,&key,&let_value,err);
        if (!bVar3) {
LAB_00118790:
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector(&let_value.parsed_);
          std::__cxx11::string::~string((string *)&key);
          bVar3 = false;
          goto LAB_0011893d;
        }
        bVar3 = std::operator!=(&key,"chdir");
        if (bVar3) {
          std::operator+(&local_1b8,"illegal key \'",&key);
          std::operator+(&local_1d8,&local_1b8,"\' (only \'chdir\' is supported)");
          Lexer::Error(this_00,&local_1d8,err);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1b8);
          goto LAB_00118790;
        }
        if (!new_scope) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"invalid use of \'chdir\' in include line",
                     (allocator<char> *)&local_1b8);
          Lexer::Error(this_00,&local_1d8,err);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector(&let_value.parsed_);
          psVar7 = &key;
          goto LAB_001189db;
        }
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"duplicate \'chdir\' in subninja",
                     (allocator<char> *)&local_1b8);
          Lexer::Error(this_00,&local_1d8,err);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector(&let_value.parsed_);
          std::__cxx11::string::~string((string *)&key);
          bVar3 = false;
          goto LAB_0011894c;
        }
        EvalString::Evaluate_abi_cxx11_(&local_1d8,&let_value,(Env *)this->env_);
        std::__cxx11::string::operator=((string *)&rel_path,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        lVar5 = std::__cxx11::string::find((char *)&rel_path,0x120c56);
        if ((((lVar5 == 0) ||
             (lVar5 = std::__cxx11::string::find((char *)&rel_path,0x120c50), lVar5 != -1)) ||
            (lVar5 = std::__cxx11::string::find((char *)&rel_path,0x120c55), lVar5 == 0)) ||
           (lVar5 = std::__cxx11::string::find((char *)&rel_path,0x120c54), lVar5 != -1)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"invalid use of \'.\' or \'..\' in chdir",
                     (allocator<char> *)&local_1b8);
          bVar3 = Lexer::Error(this_00,&local_1d8,err);
          std::__cxx11::string::~string((string *)&local_1d8);
LAB_001188f6:
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector(&let_value.parsed_);
          std::__cxx11::string::~string((string *)&key);
          goto LAB_001189e2;
        }
        pFVar1 = (this->super_Parser).file_reader_;
        iVar4 = (*pFVar1->_vptr_FileReader[4])(pFVar1,&prev_cwd,&dir_err);
        if (iVar4 != 0) {
          std::operator+(&local_1d8,"Getcwd: ",&dir_err);
          psVar7 = &local_1d8;
          std::__cxx11::string::operator=((string *)err,(string *)psVar7);
LAB_001188ef:
          std::__cxx11::string::~string((string *)psVar7);
          bVar3 = false;
          goto LAB_001188f6;
        }
        pFVar1 = (this->super_Parser).file_reader_;
        iVar4 = (*pFVar1->_vptr_FileReader[3])(pFVar1,&rel_path,&dir_err);
        if (iVar4 != 0) {
          std::operator+(&local_90,"Chdir to \'",&rel_path);
          std::operator+(&local_1b8,&local_90,"\': ");
          std::operator+(&local_1d8,&local_1b8,&dir_err);
          std::__cxx11::string::operator=((string *)err,(string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1b8);
          psVar7 = &local_90;
          goto LAB_001188ef;
        }
        std::__cxx11::string::push_back((char)&rel_path);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector(&let_value.parsed_);
        std::__cxx11::string::~string((string *)&key);
        bVar2 = true;
      }
      key._M_string_length = (size_type)(this->super_Parser).state_;
      key.field_2._M_allocated_capacity = (size_type)(this->super_Parser).file_reader_;
      key.field_2._8_8_ = 0;
      key._M_dataplus._M_p = (pointer)&PTR_Parse_0012fd68;
      if (new_scope) {
        this_01 = (BindingEnv *)operator_new(0xb0);
        parent = this->env_;
        std::operator+(&local_1d8,&parent_path,&rel_path);
        BindingEnv::BindingEnv(this_01,parent,&rel_path,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        if (rel_path._M_string_length != 0) {
          BindingEnv::AddRule(this_01,&State::kPhonyRule);
          p_Var6 = &(((this->super_Parser).state_)->paths_)._M_h._M_before_begin;
          while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
            StringPiece::AsString_abi_cxx11_(&local_1d8,(StringPiece *)(p_Var6 + 1));
            lVar5 = std::__cxx11::string::find
                              ((string *)&local_1d8,(ulong)&(this_01->super_RelPathEnv).abs_path_);
            std::__cxx11::string::~string((string *)&local_1d8);
            if (lVar5 == 0) {
              Node::ResetEnv((Node *)p_Var6[3]._M_nxt,this_01);
            }
          }
        }
      }
      bVar3 = Parser::Load((Parser *)&key,&path,err,this_00);
LAB_0011893d:
      if (bVar2) {
LAB_0011894c:
        pFVar1 = (this->super_Parser).file_reader_;
        iVar4 = (*pFVar1->_vptr_FileReader[3])(pFVar1,&prev_cwd,&dir_err);
        if ((iVar4 != 0) && (bVar3 != false)) {
          std::operator+(&local_1b8,"restore cwd = \'",&prev_cwd);
          std::operator+(&local_1d8,&local_1b8,"\': ");
          std::operator+(&key,&local_1d8,&dir_err);
          std::__cxx11::string::operator=((string *)err,(string *)&key);
          std::__cxx11::string::~string((string *)&key);
          std::__cxx11::string::~string((string *)&local_1d8);
          psVar7 = &local_1b8;
LAB_001189db:
          std::__cxx11::string::~string((string *)psVar7);
          bVar3 = false;
        }
      }
LAB_001189e2:
      std::__cxx11::string::~string((string *)&rel_path);
      std::__cxx11::string::~string((string *)&prev_cwd);
      std::__cxx11::string::~string((string *)&dir_err);
      std::__cxx11::string::~string((string *)&parent_path);
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&path);
  }
  else {
    bVar3 = false;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&eval.parsed_);
  return bVar3;
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  bool has_chdir = false;
  string parent_path = env_->AsString();
  string dir_err;
  string prev_cwd;
  string rel_path;
  bool ok = true;  // Always restore prev_cwd, even if there is an error.
  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString let_value;
    if (!ParseLet(&key, &let_value, err)) {
      ok = false;
      break;
    }
    if (key != "chdir") {
      lexer_.Error("illegal key '" + key + "' (only 'chdir' is supported)",
                   err);
      ok = false;
      break;
    }
    if (!new_scope) {
      lexer_.Error("invalid use of 'chdir' in include line", err);
      ok = false;
      break;
    }
    if (has_chdir) {
      lexer_.Error("duplicate 'chdir' in subninja", err);
      ok = false;
      break;
    }
    rel_path = let_value.Evaluate(env_);
    if (rel_path.find("./") == 0 || rel_path.find("/./") != string::npos ||
        rel_path.find("../") == 0 || rel_path.find("/../") != string::npos) {
      return lexer_.Error("invalid use of '.' or '..' in chdir", err);
    }
    if (file_reader_->Getcwd(&prev_cwd, &dir_err) != FileReader::Okay) {
      *err = "Getcwd: " + dir_err;
      return false;  // Can return because has_chdir is always false here.
    }
    if (file_reader_->Chdir(rel_path, &dir_err) != FileReader::Okay) {
      *err = "Chdir to '" + rel_path + "': " + dir_err;
      return false;
    }
    has_chdir = true;
    rel_path += '/';
  }

  if (ok) {
    ManifestParser subparser(state_, file_reader_, options_);
    if (new_scope) {
      // Note that rel_path of "" (for whatever reason) means no chdir.
      subparser.env_ = new BindingEnv(env_, rel_path,
                                      parent_path + rel_path);

      if (!rel_path.empty()) {
        subparser.env_->AddRule(&State::kPhonyRule);

        const string& abs_path = subparser.env_->AsString();
        // Find all inbound references to this chdir. Their env will be a parent
        // of subparser.env_ and assume no chdir. Replace it so that
        // subparser.env_ is used correctly with the chdir in place.
        for (State::Paths::iterator i = state_->paths_.begin();
            i != state_->paths_.end(); ++i) {
          if (i->first.AsString().find(abs_path) == 0) {
            Node* node = i->second;
            node->ResetEnv(subparser.env_);
          }
        }
      }
    } else {
      subparser.env_ = env_;
    }

    if (!subparser.Load(path, err, &lexer_)) {
      ok = false;
    }
  }

  // Restore prev_cwd. Note that has_chdir is set to true only after
  // file_reader_->Chdir() succeeds, and any errors after that set ok = false.
  // Do not smash the value of err if it was previously set.
  if (has_chdir) {
    if (file_reader_->Chdir(prev_cwd, &dir_err) != FileReader::Okay) {
      if (ok) {
        ok = false;
        *err = "restore cwd = '" + prev_cwd + "': " + dir_err;
      }
    }
  }
  return ok;
}